

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int EnsureInitialized(BrotliEncoderState *s)

{
  int iVar1;
  int in_EAX;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  byte bVar5;
  uint8_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  byte bVar6;
  
  if (s->is_initialized_ != 0) {
    return in_EAX;
  }
  uVar2 = (s->params).quality;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar8 = 0xb;
  if ((int)uVar3 < 0xb) {
    uVar8 = uVar3;
  }
  (s->params).quality = uVar8;
  if ((int)uVar2 < 3) {
    (s->params).large_window = 0;
  }
  uVar3 = (s->params).lgwin;
  uVar8 = 10;
  if (9 < (int)uVar3) {
    uVar8 = 0x1e;
    if ((s->params).large_window == 0) {
      uVar8 = 0x18;
    }
    if (uVar3 <= uVar8) goto LAB_0012777c;
  }
  uVar3 = uVar8;
  (s->params).lgwin = uVar3;
LAB_0012777c:
  uVar8 = uVar3;
  if ((1 < (int)uVar2) && (uVar8 = 0xe, 3 < uVar2)) {
    uVar8 = (s->params).lgblock;
    if (uVar8 == 0) {
      uVar8 = 0x10;
      if (((8 < uVar2) && (0x10 < uVar3)) && (uVar8 = 0x12, uVar3 < 0x12)) {
        uVar8 = uVar3;
      }
    }
    else {
      uVar2 = 0x10;
      if (0x10 < (int)uVar8) {
        uVar2 = uVar8;
      }
      uVar8 = 0x18;
      if ((int)uVar2 < 0x18) {
        uVar8 = uVar2;
      }
    }
  }
  (s->params).lgblock = uVar8;
  ChooseDistanceParams(&s->params);
  s->remaining_metadata_bytes_ = 0xffffffff;
  uVar2 = (s->params).quality;
  uVar3 = (s->params).lgwin;
  iVar1 = (s->params).lgblock;
  bVar5 = (byte)iVar1;
  bVar6 = bVar5;
  if (iVar1 < (int)uVar3) {
    bVar6 = (byte)uVar3;
  }
  uVar9 = 1 << (bVar6 + 1 & 0x1f);
  (s->ringbuffer_).size_ = uVar9;
  (s->ringbuffer_).mask_ = uVar9 - 1;
  uVar10 = 1 << (bVar5 & 0x1f);
  (s->ringbuffer_).tail_size_ = uVar10;
  (s->ringbuffer_).total_size_ = uVar10 + uVar9;
  uVar8 = 0x12;
  if (0x12 < (int)uVar3) {
    uVar8 = uVar3;
  }
  if (1 < uVar2) {
    uVar8 = uVar3;
  }
  if ((s->params).large_window == 0) {
    if (uVar8 == 0x10) {
      uVar7 = '\x01';
      uVar3 = 0;
    }
    else if (uVar8 == 0x11) {
      uVar7 = '\a';
      uVar3 = 1;
    }
    else if ((int)uVar8 < 0x12) {
      uVar3 = uVar8 * 0x10 - 0x7f;
      uVar7 = '\a';
    }
    else {
      uVar3 = uVar8 * 2 - 0x21;
      uVar7 = '\x04';
    }
  }
  else {
    uVar3 = (uVar8 & 0x3f) << 8 | 0x11;
    uVar7 = '\x0e';
  }
  s->last_bytes_ = (uint16_t)uVar3;
  s->last_bytes_bits_ = uVar7;
  if (uVar2 == 0) {
    memcpy(s->cmd_depths_,InitCommandPrefixCodes_kDefaultCommandDepths,0x80);
    pvVar4 = memcpy(s->cmd_bits_,InitCommandPrefixCodes_kDefaultCommandBits,0x100);
    uVar3 = (uint)pvVar4;
    s->cmd_code_[0] = 0xff;
    s->cmd_code_[1] = 'w';
    s->cmd_code_[2] = 0xd5;
    s->cmd_code_[3] = 0xbf;
    s->cmd_code_[4] = 0xe7;
    s->cmd_code_[5] = 0xde;
    s->cmd_code_[6] = 0xea;
    s->cmd_code_[7] = 0x9e;
    s->cmd_code_[8] = 'Q';
    s->cmd_code_[9] = ']';
    s->cmd_code_[10] = 0xde;
    s->cmd_code_[0xb] = 0xc6;
    s->cmd_code_[0xc] = 'p';
    s->cmd_code_[0xd] = 'W';
    s->cmd_code_[0xe] = 0xbc;
    s->cmd_code_[0xf] = 'X';
    s->cmd_code_[0x10] = 'X';
    s->cmd_code_[0x11] = 'X';
    s->cmd_code_[0x12] = 0xd8;
    s->cmd_code_[0x13] = 0xd8;
    s->cmd_code_[0x14] = 'X';
    s->cmd_code_[0x15] = 0xd5;
    s->cmd_code_[0x16] = 0xcb;
    s->cmd_code_[0x17] = 0x8c;
    s->cmd_code_[0x18] = 0xea;
    s->cmd_code_[0x19] = 0xe0;
    s->cmd_code_[0x1a] = 0xc3;
    s->cmd_code_[0x1b] = 0x87;
    s->cmd_code_[0x1c] = '\x1f';
    s->cmd_code_[0x1d] = 0x83;
    s->cmd_code_[0x1e] = 0xc1;
    s->cmd_code_[0x1f] = '`';
    s->cmd_code_[0x20] = '\x1c';
    s->cmd_code_[0x21] = 'g';
    s->cmd_code_[0x22] = 0xb2;
    s->cmd_code_[0x23] = 0xaa;
    s->cmd_code_[0x24] = '\x06';
    s->cmd_code_[0x25] = 0x83;
    s->cmd_code_[0x26] = 0xc1;
    s->cmd_code_[0x27] = '`';
    s->cmd_code_[0x28] = '0';
    s->cmd_code_[0x29] = '\x18';
    s->cmd_code_[0x2a] = 0xcc;
    s->cmd_code_[0x2b] = 0xa1;
    s->cmd_code_[0x2c] = 0xce;
    s->cmd_code_[0x2d] = 0x88;
    s->cmd_code_[0x2e] = 'T';
    s->cmd_code_[0x2f] = 0x94;
    s->cmd_code_[0x29] = '\x18';
    s->cmd_code_[0x2a] = 0xcc;
    s->cmd_code_[0x2b] = 0xa1;
    s->cmd_code_[0x2c] = 0xce;
    s->cmd_code_[0x2d] = 0x88;
    s->cmd_code_[0x2e] = 'T';
    s->cmd_code_[0x2f] = 0x94;
    s->cmd_code_[0x30] = 'F';
    s->cmd_code_[0x31] = 0xe1;
    s->cmd_code_[0x32] = 0xb0;
    s->cmd_code_[0x33] = 0xd0;
    s->cmd_code_[0x34] = 'N';
    s->cmd_code_[0x35] = 0xb2;
    s->cmd_code_[0x36] = 0xf7;
    s->cmd_code_[0x37] = '\x04';
    s->cmd_code_[0x38] = '\0';
    s->cmd_code_numbits_ = 0x1c0;
  }
  s->is_initialized_ = 1;
  return uVar3;
}

Assistant:

static BROTLI_BOOL EnsureInitialized(BrotliEncoderState* s) {
  if (BROTLI_IS_OOM(&s->memory_manager_)) return BROTLI_FALSE;
  if (s->is_initialized_) return BROTLI_TRUE;

  SanitizeParams(&s->params);
  s->params.lgblock = ComputeLgBlock(&s->params);
  ChooseDistanceParams(&s->params);

  s->remaining_metadata_bytes_ = BROTLI_UINT32_MAX;

  RingBufferSetup(&s->params, &s->ringbuffer_);

  /* Initialize last byte with stream header. */
  {
    int lgwin = s->params.lgwin;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
        s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
      lgwin = BROTLI_MAX(int, lgwin, 18);
    }
    EncodeWindowBits(lgwin, s->params.large_window,
                     &s->last_bytes_, &s->last_bytes_bits_);
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
    InitCommandPrefixCodes(s->cmd_depths_, s->cmd_bits_,
                           s->cmd_code_, &s->cmd_code_numbits_);
  }

  s->is_initialized_ = BROTLI_TRUE;
  return BROTLI_TRUE;
}